

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O0

void iterator_suite::test_empty(void)

{
  size_type *this;
  bool bVar1;
  iterator begin;
  iterator end;
  iterator local_58;
  iterator local_48;
  circular_view<int,18446744073709551615ul> local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  array<int,_4UL> array;
  
  span.member.next = 0;
  this = &span.member.next;
  begin = std::array<int,_4UL>::begin((array<int,_4UL> *)this);
  end = std::array<int,_4UL>::end((array<int,_4UL> *)this);
  vista::circular_view<int,18446744073709551615ul>::circular_view<int*>(local_38,begin,end);
  local_48 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_58 = vista::circular_view<int,_18446744073709551615UL>::end
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_48,&local_58);
  boost::detail::test_impl
            ("span.begin() == span.end()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x26b,"void iterator_suite::test_empty()",(bool)(-bVar1 & 1));
  return;
}

Assistant:

void test_empty()
{
    std::array<int, 4> array = {};
    circular_view<int> span(array.begin(), array.end());
    BOOST_TEST(span.begin() == span.end());
}